

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_sRGB(png_structrp png_ptr,int srgb_intent)

{
  png_byte local_15;
  int local_14;
  png_byte buf [1];
  png_structrp ppStack_10;
  int srgb_intent_local;
  png_structrp png_ptr_local;
  
  local_14 = srgb_intent;
  ppStack_10 = png_ptr;
  if (3 < srgb_intent) {
    png_warning(png_ptr,"Invalid sRGB rendering intent specified");
  }
  local_15 = (png_byte)local_14;
  png_write_complete_chunk(ppStack_10,0x73524742,&local_15,1);
  return;
}

Assistant:

void /* PRIVATE */
png_write_sRGB(png_structrp png_ptr, int srgb_intent)
{
   png_byte buf[1];

   png_debug(1, "in png_write_sRGB");

   if (srgb_intent >= PNG_sRGB_INTENT_LAST)
      png_warning(png_ptr,
          "Invalid sRGB rendering intent specified");

   buf[0]=(png_byte)srgb_intent;
   png_write_complete_chunk(png_ptr, png_sRGB, buf, (png_size_t)1);
}